

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetLinSysFn(void *arkode_mem,ARKLsLinSysFn linsys)

{
  ARKodeMem in_RSI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem *in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessLMem(in_RSI,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (local_4 == 0) {
    if ((in_RSI == (ARKodeMem)0x0) || (in_stack_ffffffffffffffd8[8] != (ARKodeMem)0x0)) {
      if (in_RSI == (ARKodeMem)0x0) {
        *(undefined4 *)(in_stack_ffffffffffffffd8 + 0x22) = 0;
        in_stack_ffffffffffffffd8[0x23] = (ARKodeMem)arkLsLinSys;
        in_stack_ffffffffffffffd8[0x24] = in_stack_ffffffffffffffe0;
      }
      else {
        *(undefined4 *)(in_stack_ffffffffffffffd8 + 0x22) = 1;
        in_stack_ffffffffffffffd8[0x23] = in_RSI;
        in_stack_ffffffffffffffd8[0x24] = (ARKodeMem)in_stack_ffffffffffffffe0->user_data;
      }
      local_4 = 0;
    }
    else {
      arkProcessError(in_stack_ffffffffffffffe0,-3,"ARKLS","arkLSSetLinSysFn",
                      "Linear system setup routine cannot be supplied for NULL SUNMatrix");
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int arkLSSetLinSysFn(void *arkode_mem, ARKLsLinSysFn linsys)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacFn",
                            &ark_mem, &arkls_mem);
  if (retval != ARKLS_SUCCESS) return(retval);

  /* return with failure if linsys cannot be used */
  if ((linsys != NULL) && (arkls_mem->A == NULL)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetLinSysFn",
                   "Linear system setup routine cannot be supplied for NULL SUNMatrix");
    return(ARKLS_ILL_INPUT);
  }

  /* set the linear system routine pointer, and update relevant flags */
  if (linsys != NULL) {
    arkls_mem->user_linsys = SUNTRUE;
    arkls_mem->linsys      = linsys;
    arkls_mem->A_data      = ark_mem->user_data;
  } else {
    arkls_mem->user_linsys = SUNFALSE;
    arkls_mem->linsys      = arkLsLinSys;
    arkls_mem->A_data      = ark_mem;
  }

  return(ARKLS_SUCCESS);
}